

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fadst8_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstirde)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  uint uVar64;
  int32_t *piVar65;
  undefined1 (*pauVar66) [32];
  undefined1 (*pauVar67) [32];
  undefined8 *puVar68;
  int in_ECX;
  char in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int col;
  __m256i y;
  __m256i x;
  __m256i v7;
  __m256i v6;
  __m256i v5;
  __m256i v4;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  __m256i u7;
  __m256i u6;
  __m256i u5;
  __m256i u4;
  __m256i u3;
  __m256i u2;
  __m256i u1;
  __m256i u0;
  __m256i zero;
  __m256i rnding;
  __m256i cospi12;
  __m256i cospim52;
  __m256i cospi52;
  __m256i cospim36;
  __m256i cospi36;
  __m256i cospi28;
  __m256i cospi44;
  __m256i cospim20;
  __m256i cospi20;
  __m256i cospi60;
  __m256i cospim4;
  __m256i cospi4;
  __m256i cospim48;
  __m256i cospi48;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospi32;
  int32_t *cospi;
  int local_2204;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  ulong uStack_58;
  
  piVar65 = cospi_arr((int)in_DL);
  uVar64 = piVar65[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar1 = vpinsrd_avx(auVar1,uVar64,2);
  auVar1 = vpinsrd_avx(auVar1,uVar64,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar2 = vpinsrd_avx(auVar2,uVar64,2);
  auVar2 = vpinsrd_avx(auVar2,uVar64,3);
  uStack_4d0 = auVar2._0_8_;
  uStack_4c8 = auVar2._8_8_;
  uVar64 = piVar65[0x10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar2 = vpinsrd_avx(auVar2,uVar64,2);
  auVar2 = vpinsrd_avx(auVar2,uVar64,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar3 = vpinsrd_avx(auVar3,uVar64,2);
  auVar3 = vpinsrd_avx(auVar3,uVar64,3);
  uStack_490 = auVar3._0_8_;
  uStack_488 = auVar3._8_8_;
  uVar64 = -piVar65[0x10];
  auVar3 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar3 = vpinsrd_avx(auVar3,uVar64,2);
  auVar3 = vpinsrd_avx(auVar3,uVar64,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar4 = vpinsrd_avx(auVar4,uVar64,2);
  auVar4 = vpinsrd_avx(auVar4,uVar64,3);
  uStack_450 = auVar4._0_8_;
  uStack_448 = auVar4._8_8_;
  uVar64 = piVar65[0x30];
  auVar4 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar4 = vpinsrd_avx(auVar4,uVar64,2);
  auVar4 = vpinsrd_avx(auVar4,uVar64,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar5 = vpinsrd_avx(auVar5,uVar64,2);
  auVar5 = vpinsrd_avx(auVar5,uVar64,3);
  uStack_410 = auVar5._0_8_;
  uStack_408 = auVar5._8_8_;
  uVar64 = -piVar65[0x30];
  auVar5 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar5 = vpinsrd_avx(auVar5,uVar64,2);
  auVar5 = vpinsrd_avx(auVar5,uVar64,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar6 = vpinsrd_avx(auVar6,uVar64,2);
  auVar6 = vpinsrd_avx(auVar6,uVar64,3);
  uStack_3d0 = auVar6._0_8_;
  uStack_3c8 = auVar6._8_8_;
  uVar64 = piVar65[4];
  auVar6 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar6 = vpinsrd_avx(auVar6,uVar64,2);
  auVar6 = vpinsrd_avx(auVar6,uVar64,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar7 = vpinsrd_avx(auVar7,uVar64,2);
  auVar7 = vpinsrd_avx(auVar7,uVar64,3);
  uStack_390 = auVar7._0_8_;
  uStack_388 = auVar7._8_8_;
  uVar64 = -piVar65[4];
  auVar7 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar7 = vpinsrd_avx(auVar7,uVar64,2);
  auVar7 = vpinsrd_avx(auVar7,uVar64,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar8 = vpinsrd_avx(auVar8,uVar64,2);
  auVar8 = vpinsrd_avx(auVar8,uVar64,3);
  uStack_350 = auVar8._0_8_;
  uStack_348 = auVar8._8_8_;
  uVar64 = piVar65[0x3c];
  auVar8 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar8 = vpinsrd_avx(auVar8,uVar64,2);
  auVar8 = vpinsrd_avx(auVar8,uVar64,3);
  auVar9 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar9 = vpinsrd_avx(auVar9,uVar64,2);
  auVar9 = vpinsrd_avx(auVar9,uVar64,3);
  uStack_310 = auVar9._0_8_;
  uStack_308 = auVar9._8_8_;
  uVar64 = piVar65[0x14];
  auVar9 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar9 = vpinsrd_avx(auVar9,uVar64,2);
  auVar9 = vpinsrd_avx(auVar9,uVar64,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar10 = vpinsrd_avx(auVar10,uVar64,2);
  auVar10 = vpinsrd_avx(auVar10,uVar64,3);
  uStack_2d0 = auVar10._0_8_;
  uStack_2c8 = auVar10._8_8_;
  uVar64 = -piVar65[0x14];
  auVar10 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar10 = vpinsrd_avx(auVar10,uVar64,2);
  auVar10 = vpinsrd_avx(auVar10,uVar64,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar11 = vpinsrd_avx(auVar11,uVar64,2);
  auVar11 = vpinsrd_avx(auVar11,uVar64,3);
  uStack_290 = auVar11._0_8_;
  uStack_288 = auVar11._8_8_;
  uVar64 = piVar65[0x2c];
  auVar11 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar11 = vpinsrd_avx(auVar11,uVar64,2);
  auVar11 = vpinsrd_avx(auVar11,uVar64,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar12 = vpinsrd_avx(auVar12,uVar64,2);
  auVar12 = vpinsrd_avx(auVar12,uVar64,3);
  uStack_250 = auVar12._0_8_;
  uStack_248 = auVar12._8_8_;
  uVar64 = piVar65[0x1c];
  auVar12 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar12 = vpinsrd_avx(auVar12,uVar64,2);
  auVar12 = vpinsrd_avx(auVar12,uVar64,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar13 = vpinsrd_avx(auVar13,uVar64,2);
  auVar13 = vpinsrd_avx(auVar13,uVar64,3);
  uStack_210 = auVar13._0_8_;
  uStack_208 = auVar13._8_8_;
  uVar64 = piVar65[0x24];
  auVar13 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar13 = vpinsrd_avx(auVar13,uVar64,2);
  auVar13 = vpinsrd_avx(auVar13,uVar64,3);
  auVar14 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar14 = vpinsrd_avx(auVar14,uVar64,2);
  auVar14 = vpinsrd_avx(auVar14,uVar64,3);
  uStack_1d0 = auVar14._0_8_;
  uStack_1c8 = auVar14._8_8_;
  uVar64 = -piVar65[0x24];
  auVar14 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar14 = vpinsrd_avx(auVar14,uVar64,2);
  auVar14 = vpinsrd_avx(auVar14,uVar64,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar15 = vpinsrd_avx(auVar15,uVar64,2);
  auVar15 = vpinsrd_avx(auVar15,uVar64,3);
  uStack_190 = auVar15._0_8_;
  uStack_188 = auVar15._8_8_;
  uVar64 = piVar65[0x34];
  auVar15 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar15 = vpinsrd_avx(auVar15,uVar64,2);
  auVar15 = vpinsrd_avx(auVar15,uVar64,3);
  auVar16 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar16 = vpinsrd_avx(auVar16,uVar64,2);
  auVar16 = vpinsrd_avx(auVar16,uVar64,3);
  uStack_150 = auVar16._0_8_;
  uStack_148 = auVar16._8_8_;
  uVar64 = -piVar65[0x34];
  auVar16 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar16 = vpinsrd_avx(auVar16,uVar64,2);
  auVar16 = vpinsrd_avx(auVar16,uVar64,3);
  auVar17 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar17 = vpinsrd_avx(auVar17,uVar64,2);
  auVar17 = vpinsrd_avx(auVar17,uVar64,3);
  uStack_110 = auVar17._0_8_;
  uStack_108 = auVar17._8_8_;
  uVar64 = piVar65[0xc];
  auVar17 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar17 = vpinsrd_avx(auVar17,uVar64,2);
  auVar17 = vpinsrd_avx(auVar17,uVar64,3);
  auVar18 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar18 = vpinsrd_avx(auVar18,uVar64,2);
  auVar18 = vpinsrd_avx(auVar18,uVar64,3);
  uStack_d0 = auVar18._0_8_;
  uStack_c8 = auVar18._8_8_;
  uVar64 = 1 << (in_DL - 1U & 0x1f);
  auVar18 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar18 = vpinsrd_avx(auVar18,uVar64,2);
  auVar18 = vpinsrd_avx(auVar18,uVar64,3);
  auVar19 = vpinsrd_avx(ZEXT416(uVar64),uVar64,1);
  auVar19 = vpinsrd_avx(auVar19,uVar64,2);
  auVar19 = vpinsrd_avx(auVar19,uVar64,3);
  uStack_90 = auVar19._0_8_;
  uStack_88 = auVar19._8_8_;
  uStack_58 = SUB328(ZEXT832(0),4);
  for (local_2204 = 0; local_2204 < in_ECX; local_2204 = local_2204 + 1) {
    pauVar66 = (undefined1 (*) [32])(in_RDI + (long)local_2204 * 0x20);
    auVar25 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 7 + local_2204) * 0x20));
    auVar26 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 3 + local_2204) * 0x20));
    auVar27 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX + local_2204) * 0x20));
    pauVar67 = (undefined1 (*) [32])(in_RDI + (long)(in_ECX * 6 + local_2204) * 0x20);
    auVar28 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 5 + local_2204) * 0x20));
    auVar63._16_8_ = uStack_4d0;
    auVar63._0_16_ = auVar1;
    auVar63._24_8_ = uStack_4c8;
    auVar20 = vpmulld_avx2(auVar26,auVar63);
    auVar62._16_8_ = uStack_4d0;
    auVar62._0_16_ = auVar1;
    auVar62._24_8_ = uStack_4c8;
    auVar21 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 4 + local_2204) * 0x20),
                           auVar62);
    auVar26 = vpaddd_avx2(auVar20,auVar21);
    auVar36._16_8_ = uStack_90;
    auVar36._0_16_ = auVar18;
    auVar36._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar36);
    auVar22 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar26 = vpsubd_avx2(auVar20,auVar21);
    auVar32._16_8_ = uStack_90;
    auVar32._0_16_ = auVar18;
    auVar32._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar32);
    auVar23 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar61._16_8_ = uStack_4d0;
    auVar61._0_16_ = auVar1;
    auVar61._24_8_ = uStack_4c8;
    auVar20 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 2 + local_2204) * 0x20),
                           auVar61);
    auVar60._16_8_ = uStack_4d0;
    auVar60._0_16_ = auVar1;
    auVar60._24_8_ = uStack_4c8;
    auVar21 = vpmulld_avx2(auVar28,auVar60);
    auVar26 = vpaddd_avx2(auVar20,auVar21);
    auVar30._16_8_ = uStack_90;
    auVar30._0_16_ = auVar18;
    auVar30._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar30);
    auVar28 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar26 = vpsubd_avx2(auVar20,auVar21);
    auVar29._16_8_ = uStack_90;
    auVar29._0_16_ = auVar18;
    auVar29._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar29);
    auVar24 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar26 = vpaddd_avx2(*pauVar66,auVar22);
    auVar20 = vpaddd_avx2(auVar25,auVar23);
    auVar29 = vpsubd_avx2(*pauVar66,auVar22);
    auVar30 = vpsubd_avx2(auVar25,auVar23);
    auVar21 = vpaddd_avx2(auVar27,auVar28);
    auVar22 = vpaddd_avx2(*pauVar67,auVar24);
    auVar31 = vpsubd_avx2(auVar27,auVar28);
    auVar32 = vpsubd_avx2(*pauVar67,auVar24);
    auVar59._16_8_ = uStack_490;
    auVar59._0_16_ = auVar2;
    auVar59._24_8_ = uStack_488;
    auVar23 = vpmulld_avx2(auVar21,auVar59);
    auVar58._16_8_ = uStack_410;
    auVar58._0_16_ = auVar4;
    auVar58._24_8_ = uStack_408;
    auVar28 = vpmulld_avx2(auVar22,auVar58);
    auVar23 = vpaddd_avx2(auVar23,auVar28);
    auVar35._16_8_ = uStack_90;
    auVar35._0_16_ = auVar18;
    auVar35._24_8_ = uStack_88;
    auVar23 = vpaddd_avx2(auVar23,auVar35);
    auVar24 = vpsrad_avx2(auVar23,ZEXT416((uint)(int)in_DL));
    auVar57._16_8_ = uStack_410;
    auVar57._0_16_ = auVar4;
    auVar57._24_8_ = uStack_408;
    auVar21 = vpmulld_avx2(auVar21,auVar57);
    auVar56._16_8_ = uStack_450;
    auVar56._0_16_ = auVar3;
    auVar56._24_8_ = uStack_448;
    auVar22 = vpmulld_avx2(auVar22,auVar56);
    auVar21 = vpaddd_avx2(auVar21,auVar22);
    auVar34._16_8_ = uStack_90;
    auVar34._0_16_ = auVar18;
    auVar34._24_8_ = uStack_88;
    auVar21 = vpaddd_avx2(auVar21,auVar34);
    auVar25 = vpsrad_avx2(auVar21,ZEXT416((uint)(int)in_DL));
    auVar55._16_8_ = uStack_3d0;
    auVar55._0_16_ = auVar5;
    auVar55._24_8_ = uStack_3c8;
    auVar21 = vpmulld_avx2(auVar31,auVar55);
    auVar54._16_8_ = uStack_490;
    auVar54._0_16_ = auVar2;
    auVar54._24_8_ = uStack_488;
    auVar22 = vpmulld_avx2(auVar32,auVar54);
    auVar21 = vpaddd_avx2(auVar21,auVar22);
    auVar33._16_8_ = uStack_90;
    auVar33._0_16_ = auVar18;
    auVar33._24_8_ = uStack_88;
    auVar21 = vpaddd_avx2(auVar21,auVar33);
    auVar27 = vpsrad_avx2(auVar21,ZEXT416((uint)(int)in_DL));
    auVar53._16_8_ = uStack_490;
    auVar53._0_16_ = auVar2;
    auVar53._24_8_ = uStack_488;
    auVar21 = vpmulld_avx2(auVar31,auVar53);
    auVar52._16_8_ = uStack_410;
    auVar52._0_16_ = auVar4;
    auVar52._24_8_ = uStack_408;
    auVar22 = vpmulld_avx2(auVar32,auVar52);
    auVar21 = vpaddd_avx2(auVar21,auVar22);
    auVar31._16_8_ = uStack_90;
    auVar31._0_16_ = auVar18;
    auVar31._24_8_ = uStack_88;
    auVar21 = vpaddd_avx2(auVar21,auVar31);
    auVar31 = vpsrad_avx2(auVar21,ZEXT416((uint)(int)in_DL));
    auVar21 = vpaddd_avx2(auVar26,auVar24);
    auVar22 = vpaddd_avx2(auVar20,auVar25);
    auVar23 = vpaddd_avx2(auVar29,auVar27);
    auVar28 = vpaddd_avx2(auVar30,auVar31);
    auVar32 = vpsubd_avx2(auVar26,auVar24);
    auVar25 = vpsubd_avx2(auVar20,auVar25);
    auVar29 = vpsubd_avx2(auVar29,auVar27);
    auVar31 = vpsubd_avx2(auVar30,auVar31);
    auVar51._16_8_ = uStack_390;
    auVar51._0_16_ = auVar6;
    auVar51._24_8_ = uStack_388;
    auVar26 = vpmulld_avx2(auVar21,auVar51);
    auVar50._16_8_ = uStack_310;
    auVar50._0_16_ = auVar8;
    auVar50._24_8_ = uStack_308;
    auVar20 = vpmulld_avx2(auVar22,auVar50);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar24._16_8_ = uStack_90;
    auVar24._0_16_ = auVar18;
    auVar24._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar24);
    auVar24 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar49._16_8_ = uStack_310;
    auVar49._0_16_ = auVar8;
    auVar49._24_8_ = uStack_308;
    auVar26 = vpmulld_avx2(auVar21,auVar49);
    auVar48._16_8_ = uStack_350;
    auVar48._0_16_ = auVar7;
    auVar48._24_8_ = uStack_348;
    auVar20 = vpmulld_avx2(auVar22,auVar48);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar21._16_8_ = uStack_90;
    auVar21._0_16_ = auVar18;
    auVar21._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar21);
    auVar21 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar47._16_8_ = uStack_2d0;
    auVar47._0_16_ = auVar9;
    auVar47._24_8_ = uStack_2c8;
    auVar26 = vpmulld_avx2(auVar23,auVar47);
    auVar46._16_8_ = uStack_250;
    auVar46._0_16_ = auVar11;
    auVar46._24_8_ = uStack_248;
    auVar20 = vpmulld_avx2(auVar28,auVar46);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar22._16_8_ = uStack_90;
    auVar22._0_16_ = auVar18;
    auVar22._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar22);
    auVar22 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar45._16_8_ = uStack_250;
    auVar45._0_16_ = auVar11;
    auVar45._24_8_ = uStack_248;
    auVar26 = vpmulld_avx2(auVar23,auVar45);
    auVar44._16_8_ = uStack_290;
    auVar44._0_16_ = auVar10;
    auVar44._24_8_ = uStack_288;
    auVar20 = vpmulld_avx2(auVar28,auVar44);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar23._16_8_ = uStack_90;
    auVar23._0_16_ = auVar18;
    auVar23._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar23);
    auVar23 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar43._16_8_ = uStack_1d0;
    auVar43._0_16_ = auVar13;
    auVar43._24_8_ = uStack_1c8;
    auVar26 = vpmulld_avx2(auVar32,auVar43);
    auVar42._16_8_ = uStack_210;
    auVar42._0_16_ = auVar12;
    auVar42._24_8_ = uStack_208;
    auVar20 = vpmulld_avx2(auVar25,auVar42);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar28._16_8_ = uStack_90;
    auVar28._0_16_ = auVar18;
    auVar28._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar28);
    auVar28 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar41._16_8_ = uStack_210;
    auVar41._0_16_ = auVar12;
    auVar41._24_8_ = uStack_208;
    auVar26 = vpmulld_avx2(auVar32,auVar41);
    auVar40._16_8_ = uStack_190;
    auVar40._0_16_ = auVar14;
    auVar40._24_8_ = uStack_188;
    auVar20 = vpmulld_avx2(auVar25,auVar40);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar25._16_8_ = uStack_90;
    auVar25._0_16_ = auVar18;
    auVar25._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar25);
    auVar25 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar39._16_8_ = uStack_150;
    auVar39._0_16_ = auVar15;
    auVar39._24_8_ = uStack_148;
    auVar26 = vpmulld_avx2(auVar29,auVar39);
    auVar38._16_8_ = uStack_d0;
    auVar38._0_16_ = auVar17;
    auVar38._24_8_ = uStack_c8;
    auVar20 = vpmulld_avx2(auVar31,auVar38);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar27._16_8_ = uStack_90;
    auVar27._0_16_ = auVar18;
    auVar27._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar27);
    auVar27 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    auVar26._16_8_ = uStack_d0;
    auVar26._0_16_ = auVar17;
    auVar26._24_8_ = uStack_c8;
    auVar26 = vpmulld_avx2(auVar29,auVar26);
    auVar37._16_8_ = uStack_110;
    auVar37._0_16_ = auVar16;
    auVar37._24_8_ = uStack_108;
    auVar20 = vpmulld_avx2(auVar31,auVar37);
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar20._16_8_ = uStack_90;
    auVar20._0_16_ = auVar18;
    auVar20._24_8_ = uStack_88;
    auVar26 = vpaddd_avx2(auVar26,auVar20);
    auVar26 = vpsrad_avx2(auVar26,ZEXT416((uint)(int)in_DL));
    local_2100 = auVar21._0_8_;
    uStack_20f8 = auVar21._8_8_;
    uStack_20f0 = auVar21._16_8_;
    uStack_20e8 = auVar21._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)local_2204 * 0x20);
    *puVar68 = local_2100;
    puVar68[1] = uStack_20f8;
    puVar68[2] = uStack_20f0;
    puVar68[3] = uStack_20e8;
    local_21a0 = auVar27._0_8_;
    uStack_2198 = auVar27._8_8_;
    uStack_2190 = auVar27._16_8_;
    uStack_2188 = auVar27._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)(in_R8D + local_2204) * 0x20);
    *puVar68 = local_21a0;
    puVar68[1] = uStack_2198;
    puVar68[2] = uStack_2190;
    puVar68[3] = uStack_2188;
    local_2140 = auVar23._0_8_;
    uStack_2138 = auVar23._8_8_;
    uStack_2130 = auVar23._16_8_;
    uStack_2128 = auVar23._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)(in_R8D * 2 + local_2204) * 0x20);
    *puVar68 = local_2140;
    puVar68[1] = uStack_2138;
    puVar68[2] = uStack_2130;
    puVar68[3] = uStack_2128;
    local_2160 = auVar28._0_8_;
    uStack_2158 = auVar28._8_8_;
    uStack_2150 = auVar28._16_8_;
    uStack_2148 = auVar28._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)(in_R8D * 3 + local_2204) * 0x20);
    *puVar68 = local_2160;
    puVar68[1] = uStack_2158;
    puVar68[2] = uStack_2150;
    puVar68[3] = uStack_2148;
    local_2180 = auVar25._0_8_;
    uStack_2178 = auVar25._8_8_;
    uStack_2170 = auVar25._16_8_;
    uStack_2168 = auVar25._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)(in_R8D * 4 + local_2204) * 0x20);
    *puVar68 = local_2180;
    puVar68[1] = uStack_2178;
    puVar68[2] = uStack_2170;
    puVar68[3] = uStack_2168;
    local_2120 = auVar22._0_8_;
    uStack_2118 = auVar22._8_8_;
    uStack_2110 = auVar22._16_8_;
    uStack_2108 = auVar22._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)(in_R8D * 5 + local_2204) * 0x20);
    *puVar68 = local_2120;
    puVar68[1] = uStack_2118;
    puVar68[2] = uStack_2110;
    puVar68[3] = uStack_2108;
    local_21c0 = auVar26._0_8_;
    uStack_21b8 = auVar26._8_8_;
    uStack_21b0 = auVar26._16_8_;
    uStack_21a8 = auVar26._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)(in_R8D * 6 + local_2204) * 0x20);
    *puVar68 = local_21c0;
    puVar68[1] = uStack_21b8;
    puVar68[2] = uStack_21b0;
    puVar68[3] = uStack_21a8;
    local_20e0 = auVar24._0_8_;
    uStack_20d8 = auVar24._8_8_;
    uStack_20d0 = auVar24._16_8_;
    uStack_20c8 = auVar24._24_8_;
    puVar68 = (undefined8 *)(in_RSI + (long)(in_R8D * 7 + local_2204) * 0x20);
    *puVar68 = local_20e0;
    puVar68[1] = uStack_20d8;
    puVar68[2] = uStack_20d0;
    puVar68[3] = uStack_20c8;
  }
  return;
}

Assistant:

static void fadst8_avx2(__m256i *in, __m256i *out, const int8_t bit,
                        const int col_num, const int outstirde) {
  (void)col_num;
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();
  __m256i u0, u1, u2, u3, u4, u5, u6, u7;
  __m256i v0, v1, v2, v3, v4, v5, v6, v7;
  __m256i x, y;
  for (int col = 0; col < col_num; ++col) {
    u0 = in[0 * col_num + col];
    u1 = _mm256_sub_epi32(zero, in[7 * col_num + col]);
    u2 = _mm256_sub_epi32(zero, in[3 * col_num + col]);
    u3 = in[4 * col_num + col];
    u4 = _mm256_sub_epi32(zero, in[1 * col_num + col]);
    u5 = in[6 * col_num + col];
    u6 = in[2 * col_num + col];
    u7 = _mm256_sub_epi32(zero, in[5 * col_num + col]);

    // stage 2
    v0 = u0;
    v1 = u1;

    x = _mm256_mullo_epi32(u2, cospi32);
    y = _mm256_mullo_epi32(u3, cospi32);
    v2 = _mm256_add_epi32(x, y);
    v2 = _mm256_add_epi32(v2, rnding);
    v2 = _mm256_srai_epi32(v2, bit);

    v3 = _mm256_sub_epi32(x, y);
    v3 = _mm256_add_epi32(v3, rnding);
    v3 = _mm256_srai_epi32(v3, bit);

    v4 = u4;
    v5 = u5;

    x = _mm256_mullo_epi32(u6, cospi32);
    y = _mm256_mullo_epi32(u7, cospi32);
    v6 = _mm256_add_epi32(x, y);
    v6 = _mm256_add_epi32(v6, rnding);
    v6 = _mm256_srai_epi32(v6, bit);

    v7 = _mm256_sub_epi32(x, y);
    v7 = _mm256_add_epi32(v7, rnding);
    v7 = _mm256_srai_epi32(v7, bit);

    // stage 3
    u0 = _mm256_add_epi32(v0, v2);
    u1 = _mm256_add_epi32(v1, v3);
    u2 = _mm256_sub_epi32(v0, v2);
    u3 = _mm256_sub_epi32(v1, v3);
    u4 = _mm256_add_epi32(v4, v6);
    u5 = _mm256_add_epi32(v5, v7);
    u6 = _mm256_sub_epi32(v4, v6);
    u7 = _mm256_sub_epi32(v5, v7);

    // stage 4
    v0 = u0;
    v1 = u1;
    v2 = u2;
    v3 = u3;

    x = _mm256_mullo_epi32(u4, cospi16);
    y = _mm256_mullo_epi32(u5, cospi48);
    v4 = _mm256_add_epi32(x, y);
    v4 = _mm256_add_epi32(v4, rnding);
    v4 = _mm256_srai_epi32(v4, bit);

    x = _mm256_mullo_epi32(u4, cospi48);
    y = _mm256_mullo_epi32(u5, cospim16);
    v5 = _mm256_add_epi32(x, y);
    v5 = _mm256_add_epi32(v5, rnding);
    v5 = _mm256_srai_epi32(v5, bit);

    x = _mm256_mullo_epi32(u6, cospim48);
    y = _mm256_mullo_epi32(u7, cospi16);
    v6 = _mm256_add_epi32(x, y);
    v6 = _mm256_add_epi32(v6, rnding);
    v6 = _mm256_srai_epi32(v6, bit);

    x = _mm256_mullo_epi32(u6, cospi16);
    y = _mm256_mullo_epi32(u7, cospi48);
    v7 = _mm256_add_epi32(x, y);
    v7 = _mm256_add_epi32(v7, rnding);
    v7 = _mm256_srai_epi32(v7, bit);

    // stage 5
    u0 = _mm256_add_epi32(v0, v4);
    u1 = _mm256_add_epi32(v1, v5);
    u2 = _mm256_add_epi32(v2, v6);
    u3 = _mm256_add_epi32(v3, v7);
    u4 = _mm256_sub_epi32(v0, v4);
    u5 = _mm256_sub_epi32(v1, v5);
    u6 = _mm256_sub_epi32(v2, v6);
    u7 = _mm256_sub_epi32(v3, v7);

    // stage 6
    x = _mm256_mullo_epi32(u0, cospi4);
    y = _mm256_mullo_epi32(u1, cospi60);
    v0 = _mm256_add_epi32(x, y);
    v0 = _mm256_add_epi32(v0, rnding);
    v0 = _mm256_srai_epi32(v0, bit);

    x = _mm256_mullo_epi32(u0, cospi60);
    y = _mm256_mullo_epi32(u1, cospim4);
    v1 = _mm256_add_epi32(x, y);
    v1 = _mm256_add_epi32(v1, rnding);
    v1 = _mm256_srai_epi32(v1, bit);

    x = _mm256_mullo_epi32(u2, cospi20);
    y = _mm256_mullo_epi32(u3, cospi44);
    v2 = _mm256_add_epi32(x, y);
    v2 = _mm256_add_epi32(v2, rnding);
    v2 = _mm256_srai_epi32(v2, bit);

    x = _mm256_mullo_epi32(u2, cospi44);
    y = _mm256_mullo_epi32(u3, cospim20);
    v3 = _mm256_add_epi32(x, y);
    v3 = _mm256_add_epi32(v3, rnding);
    v3 = _mm256_srai_epi32(v3, bit);

    x = _mm256_mullo_epi32(u4, cospi36);
    y = _mm256_mullo_epi32(u5, cospi28);
    v4 = _mm256_add_epi32(x, y);
    v4 = _mm256_add_epi32(v4, rnding);
    v4 = _mm256_srai_epi32(v4, bit);

    x = _mm256_mullo_epi32(u4, cospi28);
    y = _mm256_mullo_epi32(u5, cospim36);
    v5 = _mm256_add_epi32(x, y);
    v5 = _mm256_add_epi32(v5, rnding);
    v5 = _mm256_srai_epi32(v5, bit);

    x = _mm256_mullo_epi32(u6, cospi52);
    y = _mm256_mullo_epi32(u7, cospi12);
    v6 = _mm256_add_epi32(x, y);
    v6 = _mm256_add_epi32(v6, rnding);
    v6 = _mm256_srai_epi32(v6, bit);

    x = _mm256_mullo_epi32(u6, cospi12);
    y = _mm256_mullo_epi32(u7, cospim52);
    v7 = _mm256_add_epi32(x, y);
    v7 = _mm256_add_epi32(v7, rnding);
    v7 = _mm256_srai_epi32(v7, bit);

    // stage 7
    out[0 * outstirde + col] = v1;
    out[1 * outstirde + col] = v6;
    out[2 * outstirde + col] = v3;
    out[3 * outstirde + col] = v4;
    out[4 * outstirde + col] = v5;
    out[5 * outstirde + col] = v2;
    out[6 * outstirde + col] = v7;
    out[7 * outstirde + col] = v0;
  }
}